

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>_> *
__thiscall
tinyusdz::primvar::PrimVar::
get_value<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
          (optional<std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>_>
           *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>_>
  local_40;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  bVar1 = is_blocked(this);
  if (bVar1) {
    nonstd::optional_lite::
    optional<std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>_>::
    optional(__return_storage_ptr__);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      tinyusdz::value::Value::
      get_value<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                (&local_40,&this->_value,false);
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>_>
      ::
      optional<std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>,_0>
                (__return_storage_ptr__,&local_40);
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>_>
      ::~optional(&local_40);
    }
    else {
      nonstd::optional_lite::
      optional<std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>_>
      ::optional(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }